

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_base_convert(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_int64 local_48;
  jx9_int64 iNum;
  char *zNum;
  int local_30;
  int iTobase;
  int iFbase;
  int nLen;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  _iFbase = apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 3) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    local_30 = jx9_value_to_int(apArg[1]);
    zNum._4_4_ = jx9_value_to_int(_iFbase[2]);
    iVar1 = jx9_value_is_string(*_iFbase);
    if (iVar1 == 0) {
      local_48 = jx9_value_to_int64(*_iFbase);
    }
    else {
      iNum = (jx9_int64)jx9_value_to_string(*_iFbase,&iTobase);
      if (iTobase < 1) {
        jx9_result_string(pjStack_18,"",0);
        return 0;
      }
      if (local_30 == 2) {
        SyBinaryStrToInt64((char *)iNum,iTobase,&local_48,(char **)0x0);
      }
      else if (local_30 == 8) {
        SyOctalStrToInt64((char *)iNum,iTobase,&local_48,(char **)0x0);
      }
      else if (local_30 == 0x10) {
        SyHexStrToInt64((char *)iNum,iTobase,&local_48,(char **)0x0);
      }
      else {
        SyStrToInt64((char *)iNum,iTobase,&local_48,(char **)0x0);
      }
    }
    if (zNum._4_4_ == 2) {
      jx9_result_string_format(pjStack_18,"%qB",local_48);
    }
    else if (zNum._4_4_ == 8) {
      jx9_result_string_format(pjStack_18,"%qo",local_48);
    }
    else if (zNum._4_4_ == 0x10) {
      jx9_result_string_format(pjStack_18,"%qx",local_48);
    }
    else {
      jx9_result_string_format(pjStack_18,"%qd",local_48);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_base_convert(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int nLen, iFbase, iTobase;
	const char *zNum;
	jx9_int64 iNum;
	if( nArg < 3 ){
		/* Return the empty string*/
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Base numbers */
	iFbase  = jx9_value_to_int(apArg[1]);
	iTobase = jx9_value_to_int(apArg[2]);
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the target number */
		zNum = jx9_value_to_string(apArg[0], &nLen);
		if( nLen < 1 ){
			/* Return the empty string*/
			jx9_result_string(pCtx, "", 0);
			return JX9_OK;
		}
		/* Base conversion */
		switch(iFbase){
		case 16:
			/* Hex */
			SyHexStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		case 8:
			/* Octal */
			SyOctalStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		case 2:
			/* Binary */
			SyBinaryStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		default:
			/* Decimal */
			SyStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		}
	}else{
		iNum = jx9_value_to_int64(apArg[0]);
	}
	switch(iTobase){
	case 16:
		/* Hex */
		jx9_result_string_format(pCtx, "%qx", iNum); /* Quad hex */
		break;
	case 8:
		/* Octal */
		jx9_result_string_format(pCtx, "%qo", iNum); /* Quad octal */
		break;
	case 2:
		/* Binary */
		jx9_result_string_format(pCtx, "%qB", iNum); /* Quad binary */
		break;
	default:
		/* Decimal */
		jx9_result_string_format(pCtx, "%qd", iNum); /* Quad decimal */
		break;
	}
	return JX9_OK;
}